

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O0

void soplex::
     initPrefs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (DataArray<soplex::SPxId> *pref,
               SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *base,Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *rowWeight,
               Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *colWeight)

{
  int iVar1;
  type_conflict5 tVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  SPxId *pSVar6;
  DataArray<int> *in_RSI;
  DataArray<soplex::SPxId> *in_RDI;
  bool in_stack_0000001b;
  int in_stack_0000001c;
  Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000020;
  int in_stack_0000002c;
  int *in_stack_00000030;
  Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  compare;
  int k;
  int j;
  int i;
  DataArray<int> col;
  DataArray<int> row;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  DataArray<int> *in_stack_fffffffffffffea0;
  DataKey in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  DataKey local_90;
  DataKey local_88;
  DataKey local_80;
  DataKey local_78;
  Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_70;
  int local_68;
  int local_64;
  int local_60;
  DataArray<int> local_50;
  DataArray<int> local_38;
  DataArray<int> *local_10;
  DataArray<soplex::SPxId> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x152844);
  DataArray<int>::DataArray
            ((DataArray<int> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffea8.idx,in_stack_fffffffffffffea8.info,
             (Real)in_stack_fffffffffffffea0);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x15286a);
  DataArray<int>::DataArray
            ((DataArray<int> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffea8.idx,in_stack_fffffffffffffea8.info,
             (Real)in_stack_fffffffffffffea0);
  Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Compare(&local_70);
  for (local_60 = 0; iVar1 = local_60,
      iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x1528c8), iVar4 = local_60, iVar1 < iVar3; local_60 = local_60 + 1) {
    piVar5 = DataArray<int>::operator[](&local_38,local_60);
    *piVar5 = iVar4;
  }
  local_70.weight =
       Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ::get_const_ptr((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x15296d);
  DataArray<int>::get_ptr(&local_38);
  DataArray<int>::size(&local_38);
  SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>>
            (in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_0000001c,
             in_stack_0000001b);
  for (local_60 = 0; iVar1 = local_60,
      iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x1529f8), iVar4 = local_60, iVar1 < iVar3; local_60 = local_60 + 1) {
    piVar5 = DataArray<int>::operator[](&local_50,local_60);
    *piVar5 = iVar4;
  }
  local_70.weight =
       Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ::get_const_ptr((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x152a5e);
  DataArray<int>::get_ptr(&local_50);
  DataArray<int>::size(&local_50);
  SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>>
            (in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_0000001c,
             in_stack_0000001b);
  local_60 = 0;
  local_64 = 0;
  local_68 = 0;
  while (iVar1 = local_68, iVar4 = DataArray<soplex::SPxId>::size(local_8), iVar1 < iVar4) {
    DataArray<int>::operator[](&local_38,local_60);
    Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    DataArray<int>::operator[](&local_50,local_64);
    Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    tVar2 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x152b7c);
    iVar4 = local_60;
    iVar1 = local_64;
    if (tVar2) {
      local_60 = local_60 + 1;
      DataArray<int>::operator[](&local_38,iVar4);
      local_78 = (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::rId((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffffea8,
                                (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      iVar1 = local_68;
      local_68 = local_68 + 1;
      pSVar6 = DataArray<soplex::SPxId>::operator[](local_8,iVar1);
      SPxId::operator=(pSVar6,(SPxRowId *)&local_78);
      iVar1 = local_60;
      iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x152c28);
      if (iVar4 <= iVar1) {
        while (iVar1 = local_68, iVar3 = DataArray<soplex::SPxId>::size(local_8), iVar4 = local_64,
              iVar1 < iVar3) {
          local_64 = local_64 + 1;
          DataArray<int>::operator[](&local_50,iVar4);
          local_80 = (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::cId((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)in_stack_fffffffffffffea8,
                                    (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
          iVar1 = local_68;
          local_68 = local_68 + 1;
          pSVar6 = DataArray<soplex::SPxId>::operator[](local_8,iVar1);
          SPxId::operator=(pSVar6,(SPxColId *)&local_80);
        }
      }
    }
    else {
      local_64 = local_64 + 1;
      DataArray<int>::operator[](&local_50,iVar1);
      local_88 = (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::cId((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffffea8,
                                (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      iVar1 = local_68;
      local_68 = local_68 + 1;
      pSVar6 = DataArray<soplex::SPxId>::operator[](local_8,iVar1);
      SPxId::operator=(pSVar6,(SPxColId *)&local_88);
      iVar1 = local_64;
      iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x152d81);
      if (iVar4 <= iVar1) {
        while (iVar4 = local_68, iVar3 = DataArray<soplex::SPxId>::size(local_8), iVar1 = local_60,
              iVar4 < iVar3) {
          local_60 = local_60 + 1;
          in_stack_fffffffffffffea0 = local_10;
          DataArray<int>::operator[](&local_38,iVar1);
          in_stack_fffffffffffffea8 =
               (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::rId((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_fffffffffffffea8,
                              (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
          iVar1 = local_68;
          local_68 = local_68 + 1;
          local_90 = in_stack_fffffffffffffea8;
          pSVar6 = DataArray<soplex::SPxId>::operator[](local_8,iVar1);
          SPxId::operator=(pSVar6,(SPxRowId *)&local_90);
        }
      }
    }
  }
  DataArray<int>::~DataArray(in_stack_fffffffffffffea0);
  DataArray<int>::~DataArray(in_stack_fffffffffffffea0);
  return;
}

Assistant:

static void initPrefs(
   DataArray < SPxId >&      pref,
   const SPxSolverBase<R>&       base,
   const Array<R>& rowWeight,
   const Array<R>& colWeight)
{
   DataArray<int> row(base.nRows());
   DataArray<int> col(base.nCols());
   int i;
   int j;
   int k;

   Compare<R> compare;
   //   compare.base = &base;

   for(i = 0; i < base.nRows(); ++i)
      row[i] = i;

   compare.weight = rowWeight.get_const_ptr();

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int l = 0; l < row.size(); ++l)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(compare.weight[l]));
         // the weight formulas should not produce inf values
         assert(!isinf(compare.weight[l]));
      }
   }

#endif

   SPxQuicksort(row.get_ptr(), row.size(), compare); // Sort rows

   for(i = 0; i < base.nCols(); ++i)
      col[i] = i;

   compare.weight = colWeight.get_const_ptr();

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int l = 0; l < col.size(); ++l)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(compare.weight[l]));
         // the weight formulas should not produce inf values
         assert(!isinf(compare.weight[l]));
      }
   }

#endif

   SPxQuicksort(col.get_ptr(), col.size(), compare); // Sort column

   i = 0;
   j = 0;
   k = 0;

   while(k < pref.size())            // merge sort
   {
      if(rowWeight[row[i]] < colWeight[col[j]])
      {
         pref[k++] = base.rId(row[i++]);

         if(i >= base.nRows())
            while(k < pref.size())
               pref[k++] = base.cId(col[j++]);
      }
      else
      {
         pref[k++] = base.cId(col[j++]);

         if(j >= base.nCols())
            while(k < pref.size())
               pref[k++] = base.rId(row[i++]);
      }
   }

   assert(i == base.nRows());
   assert(j == base.nCols());
}